

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StringRef * __thiscall
Catch::StringRef::substr
          (StringRef *__return_storage_ptr__,StringRef *this,size_type start,size_type size)

{
  if (start < this->m_size) {
    StringRef(__return_storage_ptr__,this->m_data + start,size);
  }
  else {
    StringRef(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

auto StringRef::substr( size_type start, size_type size ) const -> StringRef {
        if( start < m_size )
            return StringRef( m_data+start, size );
            else
                return StringRef();
                }